

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void jinit_downsampler(j_compress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  bool bVar3;
  int iVar4;
  jpeg_downsampler *pjVar5;
  code *pcVar6;
  long lVar7;
  int *piVar8;
  
  pjVar5 = (jpeg_downsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x68);
  cinfo->downsample = pjVar5;
  pjVar5->start_pass = start_pass_downsample;
  pjVar5->downsample = sep_downsample;
  pjVar5->need_context_rows = 0;
  if (cinfo->CCIR601_sampling != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x19;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->num_components < 1) {
    bVar3 = true;
  }
  else {
    piVar8 = &cinfo->comp_info->v_samp_factor;
    bVar3 = true;
    lVar7 = 0;
    do {
      iVar4 = piVar8[-1];
      iVar1 = cinfo->max_h_samp_factor;
      if ((iVar4 == iVar1) && (*piVar8 == cinfo->max_v_samp_factor)) {
        if (cinfo->smoothing_factor == 0) {
          pcVar6 = fullsize_downsample;
LAB_0011b950:
          (&pjVar5[1].start_pass)[lVar7] = pcVar6;
        }
        else {
          (&pjVar5[1].start_pass)[lVar7] = fullsize_smooth_downsample;
LAB_0011b8ca:
          pjVar5->need_context_rows = 1;
        }
      }
      else {
        if (iVar4 * 2 == iVar1) {
          if (*piVar8 != cinfo->max_v_samp_factor) {
            if ((iVar4 * 2 == iVar1) && (*piVar8 * 2 == cinfo->max_v_samp_factor)) {
              if (cinfo->smoothing_factor == 0) {
                iVar4 = jsimd_can_h2v2_downsample();
                if (iVar4 == 0) {
                  pcVar6 = h2v2_downsample;
                }
                else {
                  pcVar6 = jsimd_h2v2_downsample;
                }
                goto LAB_0011b950;
              }
              (&pjVar5[1].start_pass)[lVar7] = h2v2_smooth_downsample;
              goto LAB_0011b8ca;
            }
            goto LAB_0011b923;
          }
          iVar4 = jsimd_can_h2v1_downsample();
          if (iVar4 == 0) {
            pcVar6 = h2v1_downsample;
          }
          else {
            pcVar6 = jsimd_h2v1_downsample;
          }
        }
        else {
LAB_0011b923:
          if ((iVar1 % iVar4 != 0) || (cinfo->max_v_samp_factor % *piVar8 != 0)) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x26;
            (*pjVar2->error_exit)((j_common_ptr)cinfo);
            goto LAB_0011b96f;
          }
          pcVar6 = int_downsample;
        }
        (&pjVar5[1].start_pass)[lVar7] = pcVar6;
        bVar3 = false;
      }
LAB_0011b96f:
      lVar7 = lVar7 + 1;
      piVar8 = piVar8 + 0x18;
    } while (lVar7 < cinfo->num_components);
  }
  if (cinfo->smoothing_factor != 0 && !bVar3) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 99;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,0);
    return;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_downsampler(j_compress_ptr cinfo)
{
  my_downsample_ptr downsample;
  int ci;
  jpeg_component_info *compptr;
  boolean smoothok = TRUE;

  downsample = (my_downsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_downsampler));
  cinfo->downsample = (struct jpeg_downsampler *)downsample;
  downsample->pub.start_pass = start_pass_downsample;
  downsample->pub.downsample = sep_downsample;
  downsample->pub.need_context_rows = FALSE;

  if (cinfo->CCIR601_sampling)
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, and set up method pointers */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    if (compptr->h_samp_factor == cinfo->max_h_samp_factor &&
        compptr->v_samp_factor == cinfo->max_v_samp_factor) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
        downsample->methods[ci] = fullsize_smooth_downsample;
        downsample->pub.need_context_rows = TRUE;
      } else
#endif
        downsample->methods[ci] = fullsize_downsample;
    } else if (compptr->h_samp_factor * 2 == cinfo->max_h_samp_factor &&
               compptr->v_samp_factor == cinfo->max_v_samp_factor) {
      smoothok = FALSE;
      if (jsimd_can_h2v1_downsample())
        downsample->methods[ci] = jsimd_h2v1_downsample;
      else
        downsample->methods[ci] = h2v1_downsample;
    } else if (compptr->h_samp_factor * 2 == cinfo->max_h_samp_factor &&
               compptr->v_samp_factor * 2 == cinfo->max_v_samp_factor) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
#if defined(__mips__)
        if (jsimd_can_h2v2_smooth_downsample())
          downsample->methods[ci] = jsimd_h2v2_smooth_downsample;
        else
#endif
          downsample->methods[ci] = h2v2_smooth_downsample;
        downsample->pub.need_context_rows = TRUE;
      } else
#endif
      {
        if (jsimd_can_h2v2_downsample())
          downsample->methods[ci] = jsimd_h2v2_downsample;
        else
          downsample->methods[ci] = h2v2_downsample;
      }
    } else if ((cinfo->max_h_samp_factor % compptr->h_samp_factor) == 0 &&
               (cinfo->max_v_samp_factor % compptr->v_samp_factor) == 0) {
      smoothok = FALSE;
      downsample->methods[ci] = int_downsample;
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
  }

#ifdef INPUT_SMOOTHING_SUPPORTED
  if (cinfo->smoothing_factor && !smoothok)
    TRACEMS(cinfo, 0, JTRC_SMOOTH_NOTIMPL);
#endif
}